

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O3

void __thiscall
embree::SceneGraph::TransformNode::setMaterial
          (TransformNode *this,Ref<embree::SceneGraph::MaterialNode> *material)

{
  Node *pNVar1;
  MaterialNode *local_10;
  
  pNVar1 = (this->child).ptr;
  local_10 = material->ptr;
  if (local_10 != (MaterialNode *)0x0) {
    (*(local_10->super_Node).super_RefCount._vptr_RefCount[2])();
  }
  (*(pNVar1->super_RefCount)._vptr_RefCount[5])(pNVar1,&local_10);
  if (local_10 != (MaterialNode *)0x0) {
    (*(local_10->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  return;
}

Assistant:

Node (bool closed = false)
        : indegree(0), closed(closed), hasLightOrCamera(false), id(-1), geometry(nullptr) {}